

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O1

bool __thiscall
cmGhsMultiTargetGenerator::ComputeCustomCommandOrder
          (cmGhsMultiTargetGenerator *this,
          vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *order)

{
  pointer ppcVar1;
  bool bVar2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1;
  pointer ppcVar3;
  bool bVar4;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  perm;
  set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  temp;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_a8;
  _Rb_tree<const_cmSourceFile_*,_const_cmSourceFile_*,_std::_Identity<const_cmSourceFile_*>,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  local_90;
  _Rb_tree<const_cmSourceFile_*,_const_cmSourceFile_*,_std::_Identity<const_cmSourceFile_*>,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  cmGeneratorTarget::GetCustomCommands(this->GeneratorTarget,&local_a8,&this->ConfigName);
  ppcVar1 = local_a8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = local_a8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_a8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  if (bVar4) {
    ppcVar3 = local_a8.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      bVar2 = VisitCustomCommand(this,(set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
                                       *)&local_60,
                                 (set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
                                  *)&local_90,order,*ppcVar3);
      if (bVar2) break;
      ppcVar3 = ppcVar3 + 1;
      bVar4 = ppcVar3 != ppcVar1;
    } while (bVar4);
  }
  if (local_a8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<const_cmSourceFile_*,_const_cmSourceFile_*,_std::_Identity<const_cmSourceFile_*>,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<const_cmSourceFile_*,_const_cmSourceFile_*,_std::_Identity<const_cmSourceFile_*>,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  ::~_Rb_tree(&local_60);
  return bVar4;
}

Assistant:

bool cmGhsMultiTargetGenerator::ComputeCustomCommandOrder(
  std::vector<cmSourceFile const*>& order)
{
  std::set<cmSourceFile const*> temp;
  std::set<cmSourceFile const*> perm;

  // Collect all custom commands for this target
  std::vector<cmSourceFile const*> customCommands;
  this->GeneratorTarget->GetCustomCommands(customCommands, this->ConfigName);

  for (cmSourceFile const* si : customCommands) {
    bool r = this->VisitCustomCommand(temp, perm, order, si);
    if (r) {
      return r;
    }
  }
  return false;
}